

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::TestParsingMergeLite::SharedDtor(MessageLite *self)

{
  TestAllTypesLite *pTVar1;
  TestParsingMergeLite_OptionalGroup *this;
  ulong uVar2;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
            (&self->_internal_metadata_);
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    pTVar1 = (TestAllTypesLite *)self[6]._vptr_MessageLite;
    if (pTVar1 != (TestAllTypesLite *)0x0) {
      TestAllTypesLite::~TestAllTypesLite(pTVar1);
    }
    operator_delete(pTVar1,0x348);
    pTVar1 = (TestAllTypesLite *)self[6]._internal_metadata_.ptr_;
    if (pTVar1 != (TestAllTypesLite *)0x0) {
      TestAllTypesLite::~TestAllTypesLite(pTVar1);
    }
    operator_delete(pTVar1,0x348);
    this = (TestParsingMergeLite_OptionalGroup *)self[7]._vptr_MessageLite;
    if (this != (TestParsingMergeLite_OptionalGroup *)0x0) {
      TestParsingMergeLite_OptionalGroup::~TestParsingMergeLite_OptionalGroup(this);
    }
    operator_delete(this,0x20);
    Impl_::~Impl_((Impl_ *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
             ,0x2172,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void TestParsingMergeLite::SharedDtor(MessageLite& self) {
  TestParsingMergeLite& this_ = static_cast<TestParsingMergeLite&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.required_all_types_;
  delete this_._impl_.optional_all_types_;
  delete this_._impl_.optionalgroup_;
  this_._impl_.~Impl_();
}